

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O3

void __thiscall Fossilize::FeatureFilter::Impl::init_features(Impl *this,void *pNext)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  VkBaseInStructure *base;
  int *piVar16;
  VkPhysicalDeviceDescriptorIndexingFeatures *pVVar17;
  byte bVar18;
  
  bVar18 = 0;
  if (pNext != (void *)0x0) {
    do {
      iVar1 = *pNext;
      if (iVar1 < 0x3b9f2730) {
        if (iVar1 < 0x3b9ddf10) {
          if (iVar1 < 0x3b9ce510) {
            if (iVar1 < 0x3b9bc018) {
              if (iVar1 < 0x3b9b3760) {
                switch(iVar1) {
                case 0x31:
                  if (*(int *)((long)pNext + 0x10) != 0) {
                    (this->features).storage_16bit.storageBuffer16BitAccess = 1;
                  }
                  if (*(int *)((long)pNext + 0x14) != 0) {
                    (this->features).storage_16bit.uniformAndStorageBuffer16BitAccess = 1;
                  }
                  if (*(int *)((long)pNext + 0x18) != 0) {
                    (this->features).storage_16bit.storagePushConstant16 = 1;
                  }
                  if (*(int *)((long)pNext + 0x1c) != 0) {
                    (this->features).storage_16bit.storageInputOutput16 = 1;
                  }
                  if (*(int *)((long)pNext + 0x20) != 0) {
                    (this->features).multiview.multiview = 1;
                  }
                  if (*(int *)((long)pNext + 0x24) != 0) {
                    (this->features).multiview.multiviewGeometryShader = 1;
                  }
                  if (*(int *)((long)pNext + 0x28) != 0) {
                    (this->features).multiview.multiviewTessellationShader = 1;
                  }
                  if (*(int *)((long)pNext + 0x2c) != 0) {
                    (this->features).variable_pointers.variablePointersStorageBuffer = 1;
                  }
                  if (*(int *)((long)pNext + 0x30) != 0) {
                    (this->features).variable_pointers.variablePointers = 1;
                  }
                  if (*(int *)((long)pNext + 0x38) != 0) {
                    (this->features).ycbcr_conversion.samplerYcbcrConversion = 1;
                  }
                  if (*(int *)((long)pNext + 0x3c) != 0) {
                    (this->features).draw_parameters.shaderDrawParameters = 1;
                  }
                  break;
                case 0x33:
                  if (*(int *)((long)pNext + 0x18) != 0) {
                    (this->features).storage_8bit.storageBuffer8BitAccess = 1;
                  }
                  if (*(int *)((long)pNext + 0x1c) != 0) {
                    (this->features).storage_8bit.uniformAndStorageBuffer8BitAccess = 1;
                  }
                  if (*(int *)((long)pNext + 0x20) != 0) {
                    (this->features).storage_8bit.storagePushConstant8 = 1;
                  }
                  if (*(int *)((long)pNext + 0x24) != 0) {
                    (this->features).atomic_int64.shaderBufferInt64Atomics = 1;
                  }
                  if (*(int *)((long)pNext + 0x28) != 0) {
                    (this->features).atomic_int64.shaderSharedInt64Atomics = 1;
                  }
                  if (*(int *)((long)pNext + 0x2c) != 0) {
                    (this->features).float16_int8.shaderFloat16 = 1;
                  }
                  if (*(int *)((long)pNext + 0x30) != 0) {
                    (this->features).float16_int8.shaderInt8 = 1;
                  }
                  if (*(int *)((long)pNext + 0x34) != 0) {
                    (this->features).vk12.descriptorIndexing = 1;
                  }
                  if (*(int *)((long)pNext + 0x38) != 0) {
                    (this->features).descriptor_indexing.shaderInputAttachmentArrayDynamicIndexing =
                         1;
                  }
                  if (*(int *)((long)pNext + 0x3c) != 0) {
                    (this->features).descriptor_indexing.
                    shaderUniformTexelBufferArrayDynamicIndexing = 1;
                  }
                  if (*(int *)((long)pNext + 0x40) != 0) {
                    (this->features).descriptor_indexing.
                    shaderStorageTexelBufferArrayDynamicIndexing = 1;
                  }
                  if (*(int *)((long)pNext + 0x44) != 0) {
                    (this->features).descriptor_indexing.shaderUniformBufferArrayNonUniformIndexing
                         = 1;
                  }
                  if (*(int *)((long)pNext + 0x48) != 0) {
                    (this->features).descriptor_indexing.shaderSampledImageArrayNonUniformIndexing =
                         1;
                  }
                  if (*(int *)((long)pNext + 0x4c) != 0) {
                    (this->features).descriptor_indexing.shaderStorageBufferArrayNonUniformIndexing
                         = 1;
                  }
                  if (*(int *)((long)pNext + 0x50) != 0) {
                    (this->features).descriptor_indexing.shaderStorageImageArrayNonUniformIndexing =
                         1;
                  }
                  if (*(int *)((long)pNext + 0x54) != 0) {
                    (this->features).descriptor_indexing.
                    shaderInputAttachmentArrayNonUniformIndexing = 1;
                  }
                  if (*(int *)((long)pNext + 0x58) != 0) {
                    (this->features).descriptor_indexing.
                    shaderUniformTexelBufferArrayNonUniformIndexing = 1;
                  }
                  if (*(int *)((long)pNext + 0x5c) != 0) {
                    (this->features).descriptor_indexing.
                    shaderStorageTexelBufferArrayNonUniformIndexing = 1;
                  }
                  if (*(int *)((long)pNext + 0x60) != 0) {
                    (this->features).descriptor_indexing.
                    descriptorBindingUniformBufferUpdateAfterBind = 1;
                  }
                  if (*(int *)((long)pNext + 100) != 0) {
                    (this->features).descriptor_indexing.
                    descriptorBindingSampledImageUpdateAfterBind = 1;
                  }
                  if (*(int *)((long)pNext + 0x68) != 0) {
                    (this->features).descriptor_indexing.
                    descriptorBindingStorageImageUpdateAfterBind = 1;
                  }
                  if (*(int *)((long)pNext + 0x6c) != 0) {
                    (this->features).descriptor_indexing.
                    descriptorBindingStorageBufferUpdateAfterBind = 1;
                  }
                  if (*(int *)((long)pNext + 0x70) != 0) {
                    (this->features).descriptor_indexing.
                    descriptorBindingUniformTexelBufferUpdateAfterBind = 1;
                  }
                  if (*(int *)((long)pNext + 0x74) != 0) {
                    (this->features).descriptor_indexing.
                    descriptorBindingStorageTexelBufferUpdateAfterBind = 1;
                  }
                  if (*(int *)((long)pNext + 0x78) != 0) {
                    (this->features).descriptor_indexing.descriptorBindingUpdateUnusedWhilePending =
                         1;
                  }
                  if (*(int *)((long)pNext + 0x7c) != 0) {
                    (this->features).descriptor_indexing.descriptorBindingPartiallyBound = 1;
                  }
                  if (*(int *)((long)pNext + 0x80) != 0) {
                    (this->features).descriptor_indexing.descriptorBindingVariableDescriptorCount =
                         1;
                  }
                  if (*(int *)((long)pNext + 0x84) != 0) {
                    (this->features).descriptor_indexing.runtimeDescriptorArray = 1;
                  }
                  if (*(int *)((long)pNext + 0x88) != 0) {
                    (this->features).vk12.samplerFilterMinmax = 1;
                  }
                  if (*(int *)((long)pNext + 0x8c) != 0) {
                    (this->features).vk12.scalarBlockLayout = 1;
                  }
                  if (*(int *)((long)pNext + 0x98) != 0) {
                    (this->features).subgroup_extended_types.shaderSubgroupExtendedTypes = 1;
                  }
                  if (*(int *)((long)pNext + 0x9c) != 0) {
                    (this->features).separate_ds_layout.separateDepthStencilLayouts = 1;
                  }
                  if (*(int *)((long)pNext + 0xa8) != 0) {
                    (this->features).buffer_device_address.bufferDeviceAddress = 1;
                  }
                  if (*(int *)((long)pNext + 0xac) != 0) {
                    (this->features).buffer_device_address.bufferDeviceAddressCaptureReplay = 1;
                  }
                  if (*(int *)((long)pNext + 0xb0) != 0) {
                    (this->features).buffer_device_address.bufferDeviceAddressMultiDevice = 1;
                  }
                  if (*(int *)((long)pNext + 0xb4) != 0) {
                    (this->features).memory_model.vulkanMemoryModel = 1;
                  }
                  if (*(int *)((long)pNext + 0xb8) != 0) {
                    (this->features).memory_model.vulkanMemoryModelDeviceScope = 1;
                  }
                  if (*(int *)((long)pNext + 0xbc) != 0) {
                    (this->features).memory_model.vulkanMemoryModelAvailabilityVisibilityChains = 1;
                  }
                  if (*(int *)((long)pNext + 0xc0) != 0) {
                    (this->features).vk12.shaderOutputViewportIndex = 1;
                  }
                  if (*(int *)((long)pNext + 0xc4) != 0) {
                    (this->features).vk12.shaderOutputLayer = 1;
                  }
                  break;
                case 0x35:
                  if (*(int *)((long)pNext + 0x10) != 0) {
                    (this->features).image_robustness.robustImageAccess = 1;
                  }
                  if (*(int *)((long)pNext + 0x14) != 0) {
                    (this->features).inline_uniform_block.inlineUniformBlock = 1;
                  }
                  if (*(int *)((long)pNext + 0x18) != 0) {
                    (this->features).inline_uniform_block.
                    descriptorBindingInlineUniformBlockUpdateAfterBind = 1;
                  }
                  if (*(int *)((long)pNext + 0x24) != 0) {
                    (this->features).demote_to_helper.shaderDemoteToHelperInvocation = 1;
                  }
                  if (*(int *)((long)pNext + 0x28) != 0) {
                    (this->features).vk13.shaderTerminateInvocation = 1;
                  }
                  if (*(int *)((long)pNext + 0x2c) != 0) {
                    (this->features).subgroup_size_control.subgroupSizeControl = 1;
                  }
                  if (*(int *)((long)pNext + 0x30) != 0) {
                    (this->features).subgroup_size_control.computeFullSubgroups = 1;
                  }
                  if (*(int *)((long)pNext + 0x34) != 0) {
                    (this->features).synchronization2.synchronization2 = 1;
                  }
                  if (*(int *)((long)pNext + 0x3c) != 0) {
                    (this->features).zero_initialize_workgroup_memory.
                    shaderZeroInitializeWorkgroupMemory = 1;
                  }
                  if (*(int *)((long)pNext + 0x40) != 0) {
                    (this->features).dynamic_rendering.dynamicRendering = 1;
                  }
                  if (*(int *)((long)pNext + 0x44) != 0) {
                    (this->features).shader_integer_dot_product.shaderIntegerDotProduct = 1;
                  }
                  if (*(int *)((long)pNext + 0x48) != 0) {
                    (this->features).maintenance4.maintenance4 = 1;
                  }
                  break;
                case 0x37:
                  if (*(int *)((long)pNext + 0x48) != 0) {
                    (this->features).dynamic_rendering_local_read.dynamicRenderingLocalRead = 1;
                  }
                  if (*(int *)((long)pNext + 0x14) != 0) {
                    (this->features).shader_subgroup_rotate.shaderSubgroupRotate = 1;
                  }
                  if (*(int *)((long)pNext + 0x18) != 0) {
                    (this->features).shader_subgroup_rotate.shaderSubgroupRotateClustered = 1;
                  }
                  if (*(int *)((long)pNext + 0x1c) != 0) {
                    (this->features).shader_float_controls2.shaderFloatControls2 = 1;
                  }
                  if (*(int *)((long)pNext + 0x20) != 0) {
                    (this->features).expect_assume.shaderExpectAssume = 1;
                  }
                  if (*(int *)((long)pNext + 0x24) != 0) {
                    (this->features).line_rasterization.rectangularLines = 1;
                  }
                  if (*(int *)((long)pNext + 0x28) != 0) {
                    (this->features).line_rasterization.bresenhamLines = 1;
                  }
                  if (*(int *)((long)pNext + 0x2c) != 0) {
                    (this->features).line_rasterization.smoothLines = 1;
                  }
                  if (*(int *)((long)pNext + 0x30) != 0) {
                    (this->features).line_rasterization.stippledRectangularLines = 1;
                  }
                  if (*(int *)((long)pNext + 0x34) != 0) {
                    (this->features).line_rasterization.stippledBresenhamLines = 1;
                  }
                  if (*(int *)((long)pNext + 0x38) != 0) {
                    (this->features).line_rasterization.stippledSmoothLines = 1;
                  }
                  if (*(int *)((long)pNext + 0x3c) != 0) {
                    (this->features).attribute_divisor.vertexAttributeInstanceRateDivisor = 1;
                  }
                  if (*(int *)((long)pNext + 0x40) != 0) {
                    (this->features).attribute_divisor.vertexAttributeInstanceRateZeroDivisor = 1;
                  }
                  if (*(int *)((long)pNext + 0x4c) != 0) {
                    (this->features).maintenance5.maintenance5 = 1;
                  }
                  if (*(int *)((long)pNext + 0x54) != 0) {
                    (this->features).pipeline_protected_access.pipelineProtectedAccess = 1;
                  }
                  if (*(int *)((long)pNext + 0x58) != 0) {
                    (this->features).pipeline_robustness.pipelineRobustness = 1;
                  }
                  if (*(int *)((long)pNext + 0x60) != 0) {
                    (this->features).vk14.pushDescriptor = 1;
                  }
                }
              }
              else if (iVar1 == 0x3b9b3760) {
                iVar1 = *(int *)((long)pNext + 0x14);
                (this->features).transform_feedback.transformFeedback = *(int *)((long)pNext + 0x10)
                ;
                (this->features).transform_feedback.geometryStreams = iVar1;
                iVar1 = *(int *)((long)pNext + 4);
                pvVar2 = *(void **)((long)pNext + 8);
                (this->features).transform_feedback.sType = *(int *)((long)pNext + 0);
                *(int *)&(this->features).transform_feedback.field_0x4 = iVar1;
                (this->features).transform_feedback.pNext = pvVar2;
                (this->features).transform_feedback.pNext = (void *)0x0;
              }
              else if (iVar1 == 0x3b9b75e3) {
                iVar1 = *(int *)((long)pNext + 0x14);
                (this->features).dynamic_rendering.dynamicRendering = *(int *)((long)pNext + 0x10);
                *(int *)&(this->features).dynamic_rendering.field_0x14 = iVar1;
                iVar1 = *(int *)((long)pNext + 4);
                pvVar2 = *(void **)((long)pNext + 8);
                (this->features).dynamic_rendering.sType = *(int *)((long)pNext + 0);
                *(int *)&(this->features).dynamic_rendering.field_0x4 = iVar1;
                (this->features).dynamic_rendering.pNext = pvVar2;
                (this->features).dynamic_rendering.pNext = (void *)0x0;
              }
              else if (iVar1 == 0x3b9b9909) {
                iVar5 = *(int *)((long)pNext + 0);
                iVar6 = *(int *)((long)pNext + 4);
                pvVar2 = *(void **)((long)pNext + 8);
                iVar1 = *(int *)((long)pNext + 0x14);
                iVar3 = *(int *)((long)pNext + 0x18);
                iVar4 = *(int *)((long)pNext + 0x1c);
                (this->features).multiview.multiview = *(int *)((long)pNext + 0x10);
                (this->features).multiview.multiviewGeometryShader = iVar1;
                (this->features).multiview.multiviewTessellationShader = iVar3;
                *(int *)&(this->features).multiview.field_0x1c = iVar4;
                (this->features).multiview.sType = iVar5;
                *(int *)&(this->features).multiview.field_0x4 = iVar6;
                (this->features).multiview.pNext = pvVar2;
                (this->features).multiview.pNext = (void *)0x0;
              }
            }
            else if (iVar1 < 0x3b9c0a50) {
              if (iVar1 == 0x3b9bc018) {
                iVar1 = *(int *)((long)pNext + 0x14);
                (this->features).draw_parameters.shaderDrawParameters = *(int *)((long)pNext + 0x10)
                ;
                *(int *)&(this->features).draw_parameters.field_0x14 = iVar1;
                iVar1 = *(int *)((long)pNext + 4);
                pvVar2 = *(void **)((long)pNext + 8);
                (this->features).draw_parameters.sType = *(int *)((long)pNext + 0);
                *(int *)&(this->features).draw_parameters.field_0x4 = iVar1;
                (this->features).draw_parameters.pNext = pvVar2;
                (this->features).draw_parameters.pNext = (void *)0x0;
              }
              else if (iVar1 == 0x3b9bd3a1) {
                iVar1 = *(int *)((long)pNext + 0x14);
                (this->features).pipeline_robustness.pipelineRobustness =
                     *(int *)((long)pNext + 0x10);
                *(int *)&(this->features).pipeline_robustness.field_0x14 = iVar1;
                iVar1 = *(int *)((long)pNext + 4);
                pvVar2 = *(void **)((long)pNext + 8);
                (this->features).pipeline_robustness.sType = *(int *)((long)pNext + 0);
                *(int *)&(this->features).pipeline_robustness.field_0x4 = iVar1;
                (this->features).pipeline_robustness.pNext = pvVar2;
                (this->features).pipeline_robustness.pNext = (void *)0x0;
              }
              else if (iVar1 == 0x3b9c0669) {
                iVar1 = *(int *)((long)pNext + 0x14);
                (this->features).conditional_rendering.conditionalRendering =
                     *(int *)((long)pNext + 0x10);
                (this->features).conditional_rendering.inheritedConditionalRendering = iVar1;
                iVar1 = *(int *)((long)pNext + 4);
                pvVar2 = *(void **)((long)pNext + 8);
                (this->features).conditional_rendering.sType = *(int *)((long)pNext + 0);
                *(int *)&(this->features).conditional_rendering.field_0x4 = iVar1;
                (this->features).conditional_rendering.pNext = pvVar2;
                (this->features).conditional_rendering.pNext = (void *)0x0;
              }
            }
            else if (iVar1 < 0x3b9c5870) {
              if (iVar1 == 0x3b9c0a50) {
                iVar1 = *(int *)((long)pNext + 0x14);
                (this->features).float16_int8.shaderFloat16 = *(int *)((long)pNext + 0x10);
                (this->features).float16_int8.shaderInt8 = iVar1;
                iVar1 = *(int *)((long)pNext + 4);
                pvVar2 = *(void **)((long)pNext + 8);
                (this->features).float16_int8.sType = *(int *)((long)pNext + 0);
                *(int *)&(this->features).float16_int8.field_0x4 = iVar1;
                (this->features).float16_int8.pNext = pvVar2;
                (this->features).float16_int8.pNext = (void *)0x0;
              }
              else if (iVar1 == 0x3b9c0e38) {
                iVar5 = *(int *)((long)pNext + 0);
                iVar6 = *(int *)((long)pNext + 4);
                pvVar2 = *(void **)((long)pNext + 8);
                iVar1 = *(int *)((long)pNext + 0x14);
                iVar3 = *(int *)((long)pNext + 0x18);
                iVar4 = *(int *)((long)pNext + 0x1c);
                (this->features).storage_16bit.storageBuffer16BitAccess =
                     *(int *)((long)pNext + 0x10);
                (this->features).storage_16bit.uniformAndStorageBuffer16BitAccess = iVar1;
                (this->features).storage_16bit.storagePushConstant16 = iVar3;
                (this->features).storage_16bit.storageInputOutput16 = iVar4;
                (this->features).storage_16bit.sType = iVar5;
                *(int *)&(this->features).storage_16bit.field_0x4 = iVar6;
                (this->features).storage_16bit.pNext = pvVar2;
                (this->features).storage_16bit.pNext = (void *)0x0;
              }
            }
            else if (iVar1 == 0x3b9c5870) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).depth_clip.depthClipEnable = *(int *)((long)pNext + 0x10);
              *(int *)&(this->features).depth_clip.field_0x14 = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).depth_clip.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).depth_clip.field_0x4 = iVar1;
              (this->features).depth_clip.pNext = pvVar2;
              (this->features).depth_clip.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9c9ec0) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).variable_pointers.variablePointersStorageBuffer =
                   *(int *)((long)pNext + 0x10);
              (this->features).variable_pointers.variablePointers = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).variable_pointers.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).variable_pointers.field_0x4 = iVar1;
              (this->features).variable_pointers.pNext = pvVar2;
              (this->features).variable_pointers.pNext = (void *)0x0;
            }
          }
          else if (iVar1 < 0x3b9d4aa1) {
            if (iVar1 < 0x3b9d2390) {
              if (iVar1 == 0x3b9ce510) {
                iVar1 = *(int *)((long)pNext + 0x14);
                (this->features).inline_uniform_block.inlineUniformBlock =
                     *(int *)((long)pNext + 0x10);
                (this->features).inline_uniform_block.
                descriptorBindingInlineUniformBlockUpdateAfterBind = iVar1;
                iVar1 = *(int *)((long)pNext + 4);
                pvVar2 = *(void **)((long)pNext + 8);
                (this->features).inline_uniform_block.sType = *(int *)((long)pNext + 0);
                *(int *)&(this->features).inline_uniform_block.field_0x4 = iVar1;
                (this->features).inline_uniform_block.pNext = pvVar2;
                (this->features).inline_uniform_block.pNext = (void *)0x0;
              }
              else if (iVar1 == 0x3b9d0c20) {
                iVar1 = *(int *)((long)pNext + 0x14);
                (this->features).blend_operation_advanced.advancedBlendCoherentOperations =
                     *(int *)((long)pNext + 0x10);
                *(int *)&(this->features).blend_operation_advanced.field_0x14 = iVar1;
                iVar1 = *(int *)((long)pNext + 4);
                pvVar2 = *(void **)((long)pNext + 8);
                (this->features).blend_operation_advanced.sType = *(int *)((long)pNext + 0);
                *(int *)&(this->features).blend_operation_advanced.field_0x4 = iVar1;
                (this->features).blend_operation_advanced.pNext = pvVar2;
                (this->features).blend_operation_advanced.pNext = (void *)0x0;
              }
              else if (iVar1 == 0x3b9d13fd) {
                iVar1 = *(int *)((long)pNext + 0x24);
                (this->features).acceleration_structure.
                descriptorBindingAccelerationStructureUpdateAfterBind = *(int *)((long)pNext + 0x20)
                ;
                *(int *)&(this->features).acceleration_structure.field_0x24 = iVar1;
                iVar5 = *(int *)((long)pNext + 0);
                iVar6 = *(int *)((long)pNext + 4);
                pvVar2 = *(void **)((long)pNext + 8);
                iVar1 = *(int *)((long)pNext + 0x14);
                iVar3 = *(int *)((long)pNext + 0x18);
                iVar4 = *(int *)((long)pNext + 0x1c);
                (this->features).acceleration_structure.accelerationStructure =
                     *(int *)((long)pNext + 0x10);
                (this->features).acceleration_structure.accelerationStructureCaptureReplay = iVar1;
                (this->features).acceleration_structure.accelerationStructureIndirectBuild = iVar3;
                (this->features).acceleration_structure.accelerationStructureHostCommands = iVar4;
                (this->features).acceleration_structure.sType = iVar5;
                *(int *)&(this->features).acceleration_structure.field_0x4 = iVar6;
                (this->features).acceleration_structure.pNext = pvVar2;
                (this->features).acceleration_structure.pNext = (void *)0x0;
              }
            }
            else if (iVar1 == 0x3b9d2390) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).sm_builtins_nv.shaderSMBuiltins = *(int *)((long)pNext + 0x10);
              *(int *)&(this->features).sm_builtins_nv.field_0x14 = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).sm_builtins_nv.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).sm_builtins_nv.field_0x4 = iVar1;
              (this->features).sm_builtins_nv.pNext = pvVar2;
              (this->features).sm_builtins_nv.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9d2b64) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).ycbcr_conversion.samplerYcbcrConversion =
                   *(int *)((long)pNext + 0x10);
              *(int *)&(this->features).ycbcr_conversion.field_0x14 = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).ycbcr_conversion.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).ycbcr_conversion.field_0x4 = iVar1;
              (this->features).ycbcr_conversion.pNext = pvVar2;
              (this->features).ycbcr_conversion.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9d3ee9) {
              piVar16 = (int *)pNext;
              pVVar17 = &(this->features).descriptor_indexing;
              for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
                iVar1 = piVar16[1];
                pVVar17->sType = piVar16[0];
                *(int *)&pVVar17->field_0x4 = iVar1;
                piVar16 = piVar16 + (ulong)bVar18 * -4 + 2;
                pVVar17 = (VkPhysicalDeviceDescriptorIndexingFeatures *)
                          ((long)pVVar17 + (ulong)bVar18 * -0x10 + 8);
              }
              (this->features).descriptor_indexing.pNext = (void *)0x0;
            }
          }
          else if (iVar1 < 0x3b9d8920) {
            if (iVar1 == 0x3b9d4aa1) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).shading_rate_nv.shadingRateImage = *(int *)((long)pNext + 0x10);
              (this->features).shading_rate_nv.shadingRateCoarseSampleOrder = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).shading_rate_nv.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).shading_rate_nv.field_0x4 = iVar1;
              (this->features).shading_rate_nv.pNext = pvVar2;
              (this->features).shading_rate_nv.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9d7598) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).subgroup_extended_types.shaderSubgroupExtendedTypes =
                   *(int *)((long)pNext + 0x10);
              *(int *)&(this->features).subgroup_extended_types.field_0x14 = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).subgroup_extended_types.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).subgroup_extended_types.field_0x4 = iVar1;
              (this->features).subgroup_extended_types.pNext = pvVar2;
              (this->features).subgroup_extended_types.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9d7d68) {
              iVar5 = *(int *)((long)pNext + 0);
              iVar6 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              iVar1 = *(int *)((long)pNext + 0x14);
              iVar3 = *(int *)((long)pNext + 0x18);
              iVar4 = *(int *)((long)pNext + 0x1c);
              (this->features).storage_8bit.storageBuffer8BitAccess = *(int *)((long)pNext + 0x10);
              (this->features).storage_8bit.uniformAndStorageBuffer8BitAccess = iVar1;
              (this->features).storage_8bit.storagePushConstant8 = iVar3;
              *(int *)&(this->features).storage_8bit.field_0x1c = iVar4;
              (this->features).storage_8bit.sType = iVar5;
              *(int *)&(this->features).storage_8bit.field_0x4 = iVar6;
              (this->features).storage_8bit.pNext = pvVar2;
              (this->features).storage_8bit.pNext = (void *)0x0;
            }
          }
          else if (iVar1 < 0x3b9db032) {
            if (iVar1 == 0x3b9d8920) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).atomic_int64.shaderBufferInt64Atomics = *(int *)((long)pNext + 0x10);
              (this->features).atomic_int64.shaderSharedInt64Atomics = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).atomic_int64.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).atomic_int64.field_0x4 = iVar1;
              (this->features).atomic_int64.pNext = pvVar2;
              (this->features).atomic_int64.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9d8d08) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).shader_clock.shaderSubgroupClock = *(int *)((long)pNext + 0x10);
              (this->features).shader_clock.shaderDeviceClock = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).shader_clock.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).shader_clock.field_0x4 = iVar1;
              (this->features).shader_clock.pNext = pvVar2;
              (this->features).shader_clock.pNext = (void *)0x0;
            }
          }
          else if (iVar1 == 0x3b9db032) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).attribute_divisor.vertexAttributeInstanceRateDivisor =
                 *(int *)((long)pNext + 0x10);
            (this->features).attribute_divisor.vertexAttributeInstanceRateZeroDivisor = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).attribute_divisor.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).attribute_divisor.field_0x4 = iVar1;
            (this->features).attribute_divisor.pNext = pvVar2;
            (this->features).attribute_divisor.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3b9ddb28) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).compute_shader_derivatives.computeDerivativeGroupQuads =
                 *(int *)((long)pNext + 0x10);
            (this->features).compute_shader_derivatives.computeDerivativeGroupLinear = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).compute_shader_derivatives.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).compute_shader_derivatives.field_0x4 = iVar1;
            (this->features).compute_shader_derivatives.pNext = pvVar2;
            (this->features).compute_shader_derivatives.pNext = (void *)0x0;
          }
        }
        else if (iVar1 < 0x3b9e96a8) {
          if (iVar1 < 0x3b9e38ea) {
            if (iVar1 < 0x3b9dfa68) {
              if (iVar1 == 0x3b9ddf10) {
                iVar1 = *(int *)((long)pNext + 0x14);
                (this->features).mesh_shader_nv.taskShader = *(int *)((long)pNext + 0x10);
                (this->features).mesh_shader_nv.meshShader = iVar1;
                iVar1 = *(int *)((long)pNext + 4);
                pvVar2 = *(void **)((long)pNext + 8);
                (this->features).mesh_shader_nv.sType = *(int *)((long)pNext + 0);
                *(int *)&(this->features).mesh_shader_nv.field_0x4 = iVar1;
                (this->features).mesh_shader_nv.pNext = pvVar2;
                (this->features).mesh_shader_nv.pNext = (void *)0x0;
              }
              else if (iVar1 == 0x3b9de2f8) {
                iVar1 = *(int *)((long)pNext + 0x14);
                (this->features).barycentric.fragmentShaderBarycentric =
                     *(int *)((long)pNext + 0x10);
                *(int *)&(this->features).barycentric.field_0x14 = iVar1;
                iVar1 = *(int *)((long)pNext + 4);
                pvVar2 = *(void **)((long)pNext + 8);
                (this->features).barycentric.sType = *(int *)((long)pNext + 0);
                *(int *)&(this->features).barycentric.field_0x4 = iVar1;
                (this->features).barycentric.pNext = pvVar2;
                (this->features).barycentric.pNext = (void *)0x0;
              }
              else if (iVar1 == 0x3b9de6e0) {
                iVar1 = *(int *)((long)pNext + 0x14);
                (this->features).image_footprint_nv.imageFootprint = *(int *)((long)pNext + 0x10);
                *(int *)&(this->features).image_footprint_nv.field_0x14 = iVar1;
                iVar1 = *(int *)((long)pNext + 4);
                pvVar2 = *(void **)((long)pNext + 8);
                (this->features).image_footprint_nv.sType = *(int *)((long)pNext + 0);
                *(int *)&(this->features).image_footprint_nv.field_0x4 = iVar1;
                (this->features).image_footprint_nv.pNext = pvVar2;
                (this->features).image_footprint_nv.pNext = (void *)0x0;
              }
            }
            else if (iVar1 == 0x3b9dfa68) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).integer_functions2_intel.shaderIntegerFunctions2 =
                   *(int *)((long)pNext + 0x10);
              *(int *)&(this->features).integer_functions2_intel.field_0x14 = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).integer_functions2_intel.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).integer_functions2_intel.field_0x4 = iVar1;
              (this->features).integer_functions2_intel.pNext = pvVar2;
              (this->features).integer_functions2_intel.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9e0238) {
              iVar5 = *(int *)((long)pNext + 0);
              iVar6 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              iVar1 = *(int *)((long)pNext + 0x14);
              iVar3 = *(int *)((long)pNext + 0x18);
              iVar4 = *(int *)((long)pNext + 0x1c);
              (this->features).memory_model.vulkanMemoryModel = *(int *)((long)pNext + 0x10);
              (this->features).memory_model.vulkanMemoryModelDeviceScope = iVar1;
              (this->features).memory_model.vulkanMemoryModelAvailabilityVisibilityChains = iVar3;
              *(int *)&(this->features).memory_model.field_0x1c = iVar4;
              (this->features).memory_model.sType = iVar5;
              *(int *)&(this->features).memory_model.field_0x4 = iVar6;
              (this->features).memory_model.pNext = pvVar2;
              (this->features).memory_model.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9e1d90) {
              iVar5 = *(int *)((long)pNext + 0);
              iVar6 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              iVar1 = *(int *)((long)pNext + 0x14);
              iVar3 = *(int *)((long)pNext + 0x18);
              iVar4 = *(int *)((long)pNext + 0x1c);
              (this->features).fragment_density.fragmentDensityMap = *(int *)((long)pNext + 0x10);
              (this->features).fragment_density.fragmentDensityMapDynamic = iVar1;
              (this->features).fragment_density.fragmentDensityMapNonSubsampledImages = iVar3;
              *(int *)&(this->features).fragment_density.field_0x1c = iVar4;
              (this->features).fragment_density.sType = iVar5;
              *(int *)&(this->features).fragment_density.field_0x4 = iVar6;
              (this->features).fragment_density.pNext = pvVar2;
              (this->features).fragment_density.pNext = (void *)0x0;
            }
          }
          else if (iVar1 < 0x3b9e5c10) {
            if (iVar1 == 0x3b9e38ea) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).subgroup_size_control.subgroupSizeControl =
                   *(int *)((long)pNext + 0x10);
              (this->features).subgroup_size_control.computeFullSubgroups = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).subgroup_size_control.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).subgroup_size_control.field_0x4 = iVar1;
              (this->features).subgroup_size_control.pNext = pvVar2;
              (this->features).subgroup_size_control.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9e3cd3) {
              iVar5 = *(int *)((long)pNext + 0);
              iVar6 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              iVar1 = *(int *)((long)pNext + 0x14);
              iVar3 = *(int *)((long)pNext + 0x18);
              iVar4 = *(int *)((long)pNext + 0x1c);
              (this->features).fragment_shading_rate.pipelineFragmentShadingRate =
                   *(int *)((long)pNext + 0x10);
              (this->features).fragment_shading_rate.primitiveFragmentShadingRate = iVar1;
              (this->features).fragment_shading_rate.attachmentFragmentShadingRate = iVar3;
              *(int *)&(this->features).fragment_shading_rate.field_0x1c = iVar4;
              (this->features).fragment_shading_rate.sType = iVar5;
              *(int *)&(this->features).fragment_shading_rate.field_0x4 = iVar6;
              (this->features).fragment_shading_rate.pNext = pvVar2;
              (this->features).fragment_shading_rate.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9e5440) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).dynamic_rendering_local_read.dynamicRenderingLocalRead =
                   *(int *)((long)pNext + 0x10);
              *(int *)&(this->features).dynamic_rendering_local_read.field_0x14 = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).dynamic_rendering_local_read.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).dynamic_rendering_local_read.field_0x4 = iVar1;
              (this->features).dynamic_rendering_local_read.pNext = pvVar2;
              (this->features).dynamic_rendering_local_read.pNext = (void *)0x0;
            }
          }
          else if (iVar1 < 0x3b9e7768) {
            if (iVar1 == 0x3b9e5c10) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).shader_image_atomic_int64.shaderImageInt64Atomics =
                   *(int *)((long)pNext + 0x10);
              (this->features).shader_image_atomic_int64.sparseImageInt64Atomics = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).shader_image_atomic_int64.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).shader_image_atomic_int64.field_0x4 = iVar1;
              (this->features).shader_image_atomic_int64.pNext = pvVar2;
              (this->features).shader_image_atomic_int64.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9e5ff8) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).shader_quad_control.shaderQuadControl = *(int *)((long)pNext + 0x10);
              *(int *)&(this->features).shader_quad_control.field_0x14 = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).shader_quad_control.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).shader_quad_control.field_0x4 = iVar1;
              (this->features).shader_quad_control.pNext = pvVar2;
              (this->features).shader_quad_control.pNext = (void *)0x0;
            }
          }
          else if (iVar1 == 0x3b9e7768) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).separate_ds_layout.separateDepthStencilLayouts =
                 *(int *)((long)pNext + 0x10);
            *(int *)&(this->features).separate_ds_layout.field_0x14 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).separate_ds_layout.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).separate_ds_layout.field_0x4 = iVar1;
            (this->features).separate_ds_layout.pNext = pvVar2;
            (this->features).separate_ds_layout.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3b9e8320) {
            iVar5 = *(int *)((long)pNext + 0);
            iVar6 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            iVar1 = *(int *)((long)pNext + 0x14);
            iVar3 = *(int *)((long)pNext + 0x18);
            iVar4 = *(int *)((long)pNext + 0x1c);
            (this->features).buffer_device_address_ext.bufferDeviceAddress =
                 *(int *)((long)pNext + 0x10);
            (this->features).buffer_device_address_ext.bufferDeviceAddressCaptureReplay = iVar1;
            (this->features).buffer_device_address_ext.bufferDeviceAddressMultiDevice = iVar3;
            *(int *)&(this->features).buffer_device_address_ext.field_0x1c = iVar4;
            (this->features).buffer_device_address_ext.sType = iVar5;
            *(int *)&(this->features).buffer_device_address_ext.field_0x4 = iVar6;
            (this->features).buffer_device_address_ext.pNext = pvVar2;
            (this->features).buffer_device_address_ext.pNext = (void *)0x0;
          }
        }
        else if (iVar1 < 0x3b9ec1a0) {
          if (iVar1 < 0x3b9eaa30) {
            if (iVar1 == 0x3b9e96a8) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).cooperative_matrix_nv.cooperativeMatrix =
                   *(int *)((long)pNext + 0x10);
              (this->features).cooperative_matrix_nv.cooperativeMatrixRobustBufferAccess = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).cooperative_matrix_nv.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).cooperative_matrix_nv.field_0x4 = iVar1;
              (this->features).cooperative_matrix_nv.pNext = pvVar2;
              (this->features).cooperative_matrix_nv.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9e9e78) {
              iVar5 = *(int *)((long)pNext + 0);
              iVar6 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              iVar1 = *(int *)((long)pNext + 0x14);
              iVar3 = *(int *)((long)pNext + 0x18);
              iVar4 = *(int *)((long)pNext + 0x1c);
              (this->features).shader_interlock.fragmentShaderSampleInterlock =
                   *(int *)((long)pNext + 0x10);
              (this->features).shader_interlock.fragmentShaderPixelInterlock = iVar1;
              (this->features).shader_interlock.fragmentShaderShadingRateInterlock = iVar3;
              *(int *)&(this->features).shader_interlock.field_0x1c = iVar4;
              (this->features).shader_interlock.sType = iVar5;
              *(int *)&(this->features).shader_interlock.field_0x4 = iVar6;
              (this->features).shader_interlock.pNext = pvVar2;
              (this->features).shader_interlock.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9ea648) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).ubo_standard_layout.uniformBufferStandardLayout =
                   *(int *)((long)pNext + 0x10);
              *(int *)&(this->features).ubo_standard_layout.field_0x14 = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).ubo_standard_layout.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).ubo_standard_layout.field_0x4 = iVar1;
              (this->features).ubo_standard_layout.pNext = pvVar2;
              (this->features).ubo_standard_layout.pNext = (void *)0x0;
            }
          }
          else if (iVar1 == 0x3b9eaa30) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).provoking_vertex.provokingVertexLast = *(int *)((long)pNext + 0x10);
            (this->features).provoking_vertex.transformFeedbackPreservesProvokingVertex = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).provoking_vertex.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).provoking_vertex.field_0x4 = iVar1;
            (this->features).provoking_vertex.pNext = pvVar2;
            (this->features).provoking_vertex.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3b9eb5e8) {
            iVar5 = *(int *)((long)pNext + 0);
            iVar6 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            iVar1 = *(int *)((long)pNext + 0x14);
            iVar3 = *(int *)((long)pNext + 0x18);
            iVar4 = *(int *)((long)pNext + 0x1c);
            (this->features).buffer_device_address.bufferDeviceAddress =
                 *(int *)((long)pNext + 0x10);
            (this->features).buffer_device_address.bufferDeviceAddressCaptureReplay = iVar1;
            (this->features).buffer_device_address.bufferDeviceAddressMultiDevice = iVar3;
            *(int *)&(this->features).buffer_device_address.field_0x1c = iVar4;
            (this->features).buffer_device_address.sType = iVar5;
            *(int *)&(this->features).buffer_device_address.field_0x4 = iVar6;
            (this->features).buffer_device_address.pNext = pvVar2;
            (this->features).buffer_device_address.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3b9ebdb8) {
            iVar1 = *(int *)((long)pNext + 0x24);
            (this->features).line_rasterization.stippledBresenhamLines =
                 *(int *)((long)pNext + 0x20);
            (this->features).line_rasterization.stippledSmoothLines = iVar1;
            iVar5 = *(int *)((long)pNext + 0);
            iVar6 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            iVar1 = *(int *)((long)pNext + 0x14);
            iVar3 = *(int *)((long)pNext + 0x18);
            iVar4 = *(int *)((long)pNext + 0x1c);
            (this->features).line_rasterization.rectangularLines = *(int *)((long)pNext + 0x10);
            (this->features).line_rasterization.bresenhamLines = iVar1;
            (this->features).line_rasterization.smoothLines = iVar3;
            (this->features).line_rasterization.stippledRectangularLines = iVar4;
            (this->features).line_rasterization.sType = iVar5;
            *(int *)&(this->features).line_rasterization.field_0x4 = iVar6;
            (this->features).line_rasterization.pNext = pvVar2;
            (this->features).line_rasterization.pNext = (void *)0x0;
          }
        }
        else if (iVar1 < 0x3b9f0020) {
          if (iVar1 == 0x3b9ec1a0) {
            iVar13 = *(int *)((long)pNext + 0);
            iVar14 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            iVar9 = *(int *)((long)pNext + 0x10);
            iVar10 = *(int *)((long)pNext + 0x14);
            iVar11 = *(int *)((long)pNext + 0x18);
            iVar12 = *(int *)((long)pNext + 0x1c);
            iVar5 = *(int *)((long)pNext + 0x20);
            iVar6 = *(int *)((long)pNext + 0x24);
            iVar7 = *(int *)((long)pNext + 0x28);
            iVar8 = *(int *)((long)pNext + 0x2c);
            iVar1 = *(int *)((long)pNext + 0x34);
            iVar3 = *(int *)((long)pNext + 0x38);
            iVar4 = *(int *)((long)pNext + 0x3c);
            (this->features).shader_atomic_float.shaderImageFloat32Atomics =
                 *(int *)((long)pNext + 0x30);
            (this->features).shader_atomic_float.shaderImageFloat32AtomicAdd = iVar1;
            (this->features).shader_atomic_float.sparseImageFloat32Atomics = iVar3;
            (this->features).shader_atomic_float.sparseImageFloat32AtomicAdd = iVar4;
            (this->features).shader_atomic_float.shaderSharedFloat32Atomics = iVar5;
            (this->features).shader_atomic_float.shaderSharedFloat32AtomicAdd = iVar6;
            (this->features).shader_atomic_float.shaderSharedFloat64Atomics = iVar7;
            (this->features).shader_atomic_float.shaderSharedFloat64AtomicAdd = iVar8;
            (this->features).shader_atomic_float.shaderBufferFloat32Atomics = iVar9;
            (this->features).shader_atomic_float.shaderBufferFloat32AtomicAdd = iVar10;
            (this->features).shader_atomic_float.shaderBufferFloat64Atomics = iVar11;
            (this->features).shader_atomic_float.shaderBufferFloat64AtomicAdd = iVar12;
            (this->features).shader_atomic_float.sType = iVar13;
            *(int *)&(this->features).shader_atomic_float.field_0x4 = iVar14;
            (this->features).shader_atomic_float.pNext = pvVar2;
            (this->features).shader_atomic_float.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3b9edcf8) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).extended_dynamic_state.extendedDynamicState =
                 *(int *)((long)pNext + 0x10);
            *(int *)&(this->features).extended_dynamic_state.field_0x14 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).extended_dynamic_state.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).extended_dynamic_state.field_0x4 = iVar1;
            (this->features).extended_dynamic_state.pNext = pvVar2;
            (this->features).extended_dynamic_state.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3b9ef468) {
            iVar13 = *(int *)((long)pNext + 0);
            iVar14 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            iVar9 = *(int *)((long)pNext + 0x10);
            iVar10 = *(int *)((long)pNext + 0x14);
            iVar11 = *(int *)((long)pNext + 0x18);
            iVar12 = *(int *)((long)pNext + 0x1c);
            iVar5 = *(int *)((long)pNext + 0x20);
            iVar6 = *(int *)((long)pNext + 0x24);
            iVar7 = *(int *)((long)pNext + 0x28);
            iVar8 = *(int *)((long)pNext + 0x2c);
            iVar1 = *(int *)((long)pNext + 0x34);
            iVar3 = *(int *)((long)pNext + 0x38);
            iVar4 = *(int *)((long)pNext + 0x3c);
            (this->features).shader_atomic_float2.shaderSharedFloat32AtomicMinMax =
                 *(int *)((long)pNext + 0x30);
            (this->features).shader_atomic_float2.shaderSharedFloat64AtomicMinMax = iVar1;
            (this->features).shader_atomic_float2.shaderImageFloat32AtomicMinMax = iVar3;
            (this->features).shader_atomic_float2.sparseImageFloat32AtomicMinMax = iVar4;
            (this->features).shader_atomic_float2.shaderBufferFloat64AtomicMinMax = iVar5;
            (this->features).shader_atomic_float2.shaderSharedFloat16Atomics = iVar6;
            (this->features).shader_atomic_float2.shaderSharedFloat16AtomicAdd = iVar7;
            (this->features).shader_atomic_float2.shaderSharedFloat16AtomicMinMax = iVar8;
            (this->features).shader_atomic_float2.shaderBufferFloat16Atomics = iVar9;
            (this->features).shader_atomic_float2.shaderBufferFloat16AtomicAdd = iVar10;
            (this->features).shader_atomic_float2.shaderBufferFloat16AtomicMinMax = iVar11;
            (this->features).shader_atomic_float2.shaderBufferFloat32AtomicMinMax = iVar12;
            (this->features).shader_atomic_float2.sType = iVar13;
            *(int *)&(this->features).shader_atomic_float2.field_0x4 = iVar14;
            (this->features).shader_atomic_float2.pNext = pvVar2;
            (this->features).shader_atomic_float2.pNext = (void *)0x0;
          }
        }
        else if (iVar1 < 0x3b9f0fc0) {
          if (iVar1 == 0x3b9f0020) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).demote_to_helper.shaderDemoteToHelperInvocation =
                 *(int *)((long)pNext + 0x10);
            *(int *)&(this->features).demote_to_helper.field_0x14 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).demote_to_helper.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).demote_to_helper.field_0x4 = iVar1;
            (this->features).demote_to_helper.pNext = pvVar2;
            (this->features).demote_to_helper.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3b9f040f) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).device_generated_commands_nv.deviceGeneratedCommands =
                 *(int *)((long)pNext + 0x10);
            *(int *)&(this->features).device_generated_commands_nv.field_0x14 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).device_generated_commands_nv.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).device_generated_commands_nv.field_0x4 = iVar1;
            (this->features).device_generated_commands_nv.pNext = pvVar2;
            (this->features).device_generated_commands_nv.pNext = (void *)0x0;
          }
        }
        else if (iVar1 == 0x3b9f0fc0) {
          iVar1 = *(int *)((long)pNext + 0x14);
          (this->features).shader_integer_dot_product.shaderIntegerDotProduct =
               *(int *)((long)pNext + 0x10);
          *(int *)&(this->features).shader_integer_dot_product.field_0x14 = iVar1;
          iVar1 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          (this->features).shader_integer_dot_product.sType = *(int *)((long)pNext + 0);
          *(int *)&(this->features).shader_integer_dot_product.field_0x4 = iVar1;
          (this->features).shader_integer_dot_product.pNext = pvVar2;
          (this->features).shader_integer_dot_product.pNext = (void *)0x0;
        }
        else if (iVar1 == 0x3b9f1b78) {
          iVar5 = *(int *)((long)pNext + 0);
          iVar6 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          iVar1 = *(int *)((long)pNext + 0x14);
          iVar3 = *(int *)((long)pNext + 0x18);
          iVar4 = *(int *)((long)pNext + 0x1c);
          (this->features).depth_bias_control.depthBiasControl = *(int *)((long)pNext + 0x10);
          (this->features).depth_bias_control.leastRepresentableValueForceUnormRepresentation =
               iVar1;
          (this->features).depth_bias_control.floatRepresentation = iVar3;
          (this->features).depth_bias_control.depthBiasExact = iVar4;
          (this->features).depth_bias_control.sType = iVar5;
          *(int *)&(this->features).depth_bias_control.field_0x4 = iVar6;
          (this->features).depth_bias_control.pNext = pvVar2;
          (this->features).depth_bias_control.pNext = (void *)0x0;
        }
      }
      else if (iVar1 < 0x3ba10f78) {
        if (iVar1 < 0x3ba01578) {
          if (iVar1 < 0x3b9fc371) {
            if (iVar1 < 0x3b9f9c62) {
              if (iVar1 == 0x3b9f2730) {
                iVar5 = *(int *)((long)pNext + 0);
                iVar6 = *(int *)((long)pNext + 4);
                pvVar2 = *(void **)((long)pNext + 8);
                iVar1 = *(int *)((long)pNext + 0x14);
                iVar3 = *(int *)((long)pNext + 0x18);
                iVar4 = *(int *)((long)pNext + 0x1c);
                (this->features).robustness2.robustBufferAccess2 = *(int *)((long)pNext + 0x10);
                (this->features).robustness2.robustImageAccess2 = iVar1;
                (this->features).robustness2.nullDescriptor = iVar3;
                *(int *)&(this->features).robustness2.field_0x1c = iVar4;
                (this->features).robustness2.sType = iVar5;
                *(int *)&(this->features).robustness2.field_0x4 = iVar6;
                (this->features).robustness2.pNext = pvVar2;
                (this->features).robustness2.pNext = (void *)0x0;
              }
              else if (iVar1 == 0x3b9f2b1a) {
                iVar1 = *(int *)((long)pNext + 0x14);
                (this->features).custom_border_color.customBorderColors =
                     *(int *)((long)pNext + 0x10);
                (this->features).custom_border_color.customBorderColorWithoutFormat = iVar1;
                iVar1 = *(int *)((long)pNext + 4);
                pvVar2 = *(void **)((long)pNext + 8);
                (this->features).custom_border_color.sType = *(int *)((long)pNext + 0);
                *(int *)&(this->features).custom_border_color.field_0x4 = iVar1;
                (this->features).custom_border_color.pNext = pvVar2;
                (this->features).custom_border_color.pNext = (void *)0x0;
              }
              else if (iVar1 == 0x3b9f9497) {
                iVar1 = *(int *)((long)pNext + 0x14);
                (this->features).synchronization2.synchronization2 = *(int *)((long)pNext + 0x10);
                *(int *)&(this->features).synchronization2.field_0x14 = iVar1;
                iVar1 = *(int *)((long)pNext + 4);
                pvVar2 = *(void **)((long)pNext + 8);
                (this->features).synchronization2.sType = *(int *)((long)pNext + 0);
                *(int *)&(this->features).synchronization2.field_0x4 = iVar1;
                (this->features).synchronization2.pNext = pvVar2;
                (this->features).synchronization2.pNext = (void *)0x0;
              }
            }
            else if (iVar1 == 0x3b9f9c62) {
              iVar5 = *(int *)((long)pNext + 0);
              iVar6 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              iVar1 = *(int *)((long)pNext + 0x14);
              iVar3 = *(int *)((long)pNext + 0x18);
              iVar4 = *(int *)((long)pNext + 0x1c);
              (this->features).descriptor_buffer.descriptorBuffer = *(int *)((long)pNext + 0x10);
              (this->features).descriptor_buffer.descriptorBufferCaptureReplay = iVar1;
              (this->features).descriptor_buffer.descriptorBufferImageLayoutIgnored = iVar3;
              (this->features).descriptor_buffer.descriptorBufferPushDescriptors = iVar4;
              (this->features).descriptor_buffer.sType = iVar5;
              *(int *)&(this->features).descriptor_buffer.field_0x4 = iVar6;
              (this->features).descriptor_buffer.pNext = pvVar2;
              (this->features).descriptor_buffer.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9fac00) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).graphics_pipeline_library.graphicsPipelineLibrary =
                   *(int *)((long)pNext + 0x10);
              *(int *)&(this->features).graphics_pipeline_library.field_0x14 = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).graphics_pipeline_library.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).graphics_pipeline_library.field_0x4 = iVar1;
              (this->features).graphics_pipeline_library.pNext = pvVar2;
              (this->features).graphics_pipeline_library.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9fbf88) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).zero_initialize_workgroup_memory.shaderZeroInitializeWorkgroupMemory
                   = *(int *)((long)pNext + 0x10);
              *(int *)&(this->features).zero_initialize_workgroup_memory.field_0x14 = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).zero_initialize_workgroup_memory.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).zero_initialize_workgroup_memory.field_0x4 = iVar1;
              (this->features).zero_initialize_workgroup_memory.pNext = pvVar2;
              (this->features).zero_initialize_workgroup_memory.pNext = (void *)0x0;
            }
          }
          else if (iVar1 < 0x3b9fe698) {
            if (iVar1 == 0x3b9fc371) {
              iVar5 = *(int *)((long)pNext + 0);
              iVar6 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              iVar1 = *(int *)((long)pNext + 0x14);
              iVar3 = *(int *)((long)pNext + 0x18);
              iVar4 = *(int *)((long)pNext + 0x1c);
              (this->features).fragment_shading_rate_enums.fragmentShadingRateEnums =
                   *(int *)((long)pNext + 0x10);
              (this->features).fragment_shading_rate_enums.supersampleFragmentShadingRates = iVar1;
              (this->features).fragment_shading_rate_enums.noInvocationFragmentShadingRates = iVar3;
              *(int *)&(this->features).fragment_shading_rate_enums.field_0x1c = iVar4;
              (this->features).fragment_shading_rate_enums.sType = iVar5;
              *(int *)&(this->features).fragment_shading_rate_enums.field_0x4 = iVar6;
              (this->features).fragment_shading_rate_enums.pNext = pvVar2;
              (this->features).fragment_shading_rate_enums.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9fc759) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).ray_tracing_motion_blur_nv.rayTracingMotionBlur =
                   *(int *)((long)pNext + 0x10);
              (this->features).ray_tracing_motion_blur_nv.
              rayTracingMotionBlurPipelineTraceRaysIndirect = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).ray_tracing_motion_blur_nv.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).ray_tracing_motion_blur_nv.field_0x4 = iVar1;
              (this->features).ray_tracing_motion_blur_nv.pNext = pvVar2;
              (this->features).ray_tracing_motion_blur_nv.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9fcb40) {
              iVar1 = *(int *)((long)pNext + 0x24);
              (this->features).mesh_shader.meshShaderQueries = *(int *)((long)pNext + 0x20);
              *(int *)&(this->features).mesh_shader.field_0x24 = iVar1;
              iVar5 = *(int *)((long)pNext + 0);
              iVar6 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              iVar1 = *(int *)((long)pNext + 0x14);
              iVar3 = *(int *)((long)pNext + 0x18);
              iVar4 = *(int *)((long)pNext + 0x1c);
              (this->features).mesh_shader.taskShader = *(int *)((long)pNext + 0x10);
              (this->features).mesh_shader.meshShader = iVar1;
              (this->features).mesh_shader.multiviewMeshShader = iVar3;
              (this->features).mesh_shader.primitiveFragmentShadingRateMeshShader = iVar4;
              (this->features).mesh_shader.sType = iVar5;
              *(int *)&(this->features).mesh_shader.field_0x4 = iVar6;
              (this->features).mesh_shader.pNext = pvVar2;
              (this->features).mesh_shader.pNext = (void *)0x0;
            }
          }
          else if (iVar1 < 0x3b9ff638) {
            if (iVar1 == 0x3b9fe698) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).image_robustness.robustImageAccess = *(int *)((long)pNext + 0x10);
              *(int *)&(this->features).image_robustness.field_0x14 = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).image_robustness.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).image_robustness.field_0x4 = iVar1;
              (this->features).image_robustness.pNext = pvVar2;
              (this->features).image_robustness.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3b9fea80) {
              iVar5 = *(int *)((long)pNext + 0);
              iVar6 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              iVar1 = *(int *)((long)pNext + 0x14);
              iVar3 = *(int *)((long)pNext + 0x18);
              iVar4 = *(int *)((long)pNext + 0x1c);
              (this->features).workgroup_memory_explicit_layout.workgroupMemoryExplicitLayout =
                   *(int *)((long)pNext + 0x10);
              (this->features).workgroup_memory_explicit_layout.
              workgroupMemoryExplicitLayoutScalarBlockLayout = iVar1;
              (this->features).workgroup_memory_explicit_layout.
              workgroupMemoryExplicitLayout8BitAccess = iVar3;
              (this->features).workgroup_memory_explicit_layout.
              workgroupMemoryExplicitLayout16BitAccess = iVar4;
              (this->features).workgroup_memory_explicit_layout.sType = iVar5;
              *(int *)&(this->features).workgroup_memory_explicit_layout.field_0x4 = iVar6;
              (this->features).workgroup_memory_explicit_layout.pNext = pvVar2;
              (this->features).workgroup_memory_explicit_layout.pNext = (void *)0x0;
            }
          }
          else if (iVar1 == 0x3b9ff638) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).attachment_feedback_loop_layout.attachmentFeedbackLoopLayout =
                 *(int *)((long)pNext + 0x10);
            *(int *)&(this->features).attachment_feedback_loop_layout.field_0x14 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).attachment_feedback_loop_layout.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).attachment_feedback_loop_layout.field_0x4 = iVar1;
            (this->features).attachment_feedback_loop_layout.pNext = pvVar2;
            (this->features).attachment_feedback_loop_layout.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3ba001f0) {
            iVar5 = *(int *)((long)pNext + 0);
            iVar6 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            iVar1 = *(int *)((long)pNext + 0x14);
            iVar3 = *(int *)((long)pNext + 0x18);
            iVar4 = *(int *)((long)pNext + 0x1c);
            (this->features).rasterization_order_attachment_access.
            rasterizationOrderColorAttachmentAccess = *(int *)((long)pNext + 0x10);
            (this->features).rasterization_order_attachment_access.
            rasterizationOrderDepthAttachmentAccess = iVar1;
            (this->features).rasterization_order_attachment_access.
            rasterizationOrderStencilAttachmentAccess = iVar3;
            *(int *)&(this->features).rasterization_order_attachment_access.field_0x1c = iVar4;
            (this->features).rasterization_order_attachment_access.sType = iVar5;
            *(int *)&(this->features).rasterization_order_attachment_access.field_0x4 = iVar6;
            (this->features).rasterization_order_attachment_access.pNext = pvVar2;
            (this->features).rasterization_order_attachment_access.pNext = (void *)0x0;
          }
        }
        else if (iVar1 < 0x3ba08aa8) {
          if (iVar1 < 0x3ba02900) {
            if (iVar1 == 0x3ba01578) {
              iVar1 = *(int *)((long)pNext + 0x24);
              (this->features).ray_tracing_pipeline.rayTraversalPrimitiveCulling =
                   *(int *)((long)pNext + 0x20);
              *(int *)&(this->features).ray_tracing_pipeline.field_0x24 = iVar1;
              iVar5 = *(int *)((long)pNext + 0);
              iVar6 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              iVar1 = *(int *)((long)pNext + 0x14);
              iVar3 = *(int *)((long)pNext + 0x18);
              iVar4 = *(int *)((long)pNext + 0x1c);
              (this->features).ray_tracing_pipeline.rayTracingPipeline =
                   *(int *)((long)pNext + 0x10);
              (this->features).ray_tracing_pipeline.rayTracingPipelineShaderGroupHandleCaptureReplay
                   = iVar1;
              (this->features).ray_tracing_pipeline.
              rayTracingPipelineShaderGroupHandleCaptureReplayMixed = iVar3;
              (this->features).ray_tracing_pipeline.rayTracingPipelineTraceRaysIndirect = iVar4;
              (this->features).ray_tracing_pipeline.sType = iVar5;
              *(int *)&(this->features).ray_tracing_pipeline.field_0x4 = iVar6;
              (this->features).ray_tracing_pipeline.pNext = pvVar2;
              (this->features).ray_tracing_pipeline.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3ba0196d) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).ray_query.rayQuery = *(int *)((long)pNext + 0x10);
              *(int *)&(this->features).ray_query.field_0x14 = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).ray_query.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).ray_query.field_0x4 = iVar1;
              (this->features).ray_query.pNext = pvVar2;
              (this->features).ray_query.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3ba02518) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).mutable_descriptor_type.mutableDescriptorType =
                   *(int *)((long)pNext + 0x10);
              *(int *)&(this->features).mutable_descriptor_type.field_0x14 = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).mutable_descriptor_type.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).mutable_descriptor_type.field_0x4 = iVar1;
              (this->features).mutable_descriptor_type.pNext = pvVar2;
              (this->features).mutable_descriptor_type.pNext = (void *)0x0;
            }
          }
          else if (iVar1 == 0x3ba02900) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).vertex_input_dynamic_state.vertexInputDynamicState =
                 *(int *)((long)pNext + 0x10);
            *(int *)&(this->features).vertex_input_dynamic_state.field_0x14 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).vertex_input_dynamic_state.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).vertex_input_dynamic_state.field_0x4 = iVar1;
            (this->features).vertex_input_dynamic_state.pNext = pvVar2;
            (this->features).vertex_input_dynamic_state.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3ba034b8) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).depth_clip_control.depthClipControl = *(int *)((long)pNext + 0x10);
            *(int *)&(this->features).depth_clip_control.field_0x14 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).depth_clip_control.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).depth_clip_control.field_0x4 = iVar1;
            (this->features).depth_clip_control.pNext = pvVar2;
            (this->features).depth_clip_control.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3ba086c0) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).multisampled_render_to_single_sampled.multisampledRenderToSingleSampled
                 = *(int *)((long)pNext + 0x10);
            *(int *)&(this->features).multisampled_render_to_single_sampled.field_0x14 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).multisampled_render_to_single_sampled.sType = *(int *)((long)pNext + 0)
            ;
            *(int *)&(this->features).multisampled_render_to_single_sampled.field_0x4 = iVar1;
            (this->features).multisampled_render_to_single_sampled.pNext = pvVar2;
            (this->features).multisampled_render_to_single_sampled.pNext = (void *)0x0;
          }
        }
        else if (iVar1 < 0x3ba0add0) {
          if (iVar1 == 0x3ba08aa8) {
            iVar5 = *(int *)((long)pNext + 0);
            iVar6 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            iVar1 = *(int *)((long)pNext + 0x14);
            iVar3 = *(int *)((long)pNext + 0x18);
            iVar4 = *(int *)((long)pNext + 0x1c);
            (this->features).extended_dynamic_state2.extendedDynamicState2 =
                 *(int *)((long)pNext + 0x10);
            (this->features).extended_dynamic_state2.extendedDynamicState2LogicOp = iVar1;
            (this->features).extended_dynamic_state2.extendedDynamicState2PatchControlPoints = iVar3
            ;
            *(int *)&(this->features).extended_dynamic_state2.field_0x1c = iVar4;
            (this->features).extended_dynamic_state2.sType = iVar5;
            *(int *)&(this->features).extended_dynamic_state2.field_0x4 = iVar6;
            (this->features).extended_dynamic_state2.pNext = pvVar2;
            (this->features).extended_dynamic_state2.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3ba09a48) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).color_write_enable.colorWriteEnable = *(int *)((long)pNext + 0x10);
            *(int *)&(this->features).color_write_enable.field_0x14 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).color_write_enable.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).color_write_enable.field_0x4 = iVar1;
            (this->features).color_write_enable.pNext = pvVar2;
            (this->features).color_write_enable.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3ba09e30) {
            iVar5 = *(int *)((long)pNext + 0);
            iVar6 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            iVar1 = *(int *)((long)pNext + 0x14);
            iVar3 = *(int *)((long)pNext + 0x18);
            iVar4 = *(int *)((long)pNext + 0x1c);
            (this->features).primitives_generated_query.primitivesGeneratedQuery =
                 *(int *)((long)pNext + 0x10);
            (this->features).primitives_generated_query.
            primitivesGeneratedQueryWithRasterizerDiscard = iVar1;
            (this->features).primitives_generated_query.primitivesGeneratedQueryWithNonZeroStreams =
                 iVar3;
            *(int *)&(this->features).primitives_generated_query.field_0x1c = iVar4;
            (this->features).primitives_generated_query.sType = iVar5;
            *(int *)&(this->features).primitives_generated_query.field_0x4 = iVar6;
            (this->features).primitives_generated_query.pNext = pvVar2;
            (this->features).primitives_generated_query.pNext = (void *)0x0;
          }
        }
        else if (iVar1 < 0x3ba0d0f8) {
          if (iVar1 == 0x3ba0add0) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).ray_tracing_maintenance1.rayTracingMaintenance1 =
                 *(int *)((long)pNext + 0x10);
            (this->features).ray_tracing_maintenance1.rayTracingPipelineTraceRaysIndirect2 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).ray_tracing_maintenance1.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).ray_tracing_maintenance1.field_0x4 = iVar1;
            (this->features).ray_tracing_maintenance1.pNext = pvVar2;
            (this->features).ray_tracing_maintenance1.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3ba0c928) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).image_2d_view_of_3d.image2DViewOf3D = *(int *)((long)pNext + 0x10);
            (this->features).image_2d_view_of_3d.sampler2DViewOf3D = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).image_2d_view_of_3d.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).image_2d_view_of_3d.field_0x4 = iVar1;
            (this->features).image_2d_view_of_3d.pNext = pvVar2;
            (this->features).image_2d_view_of_3d.pNext = (void *)0x0;
          }
        }
        else if (iVar1 == 0x3ba0d0f8) {
          iVar5 = *(int *)((long)pNext + 0);
          iVar6 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          iVar1 = *(int *)((long)pNext + 0x14);
          iVar3 = *(int *)((long)pNext + 0x18);
          iVar4 = *(int *)((long)pNext + 0x1c);
          (this->features).shader_tile_image.shaderTileImageColorReadAccess =
               *(int *)((long)pNext + 0x10);
          (this->features).shader_tile_image.shaderTileImageDepthReadAccess = iVar1;
          (this->features).shader_tile_image.shaderTileImageStencilReadAccess = iVar3;
          *(int *)&(this->features).shader_tile_image.field_0x1c = iVar4;
          (this->features).shader_tile_image.sType = iVar5;
          *(int *)&(this->features).shader_tile_image.field_0x4 = iVar6;
          (this->features).shader_tile_image.pNext = pvVar2;
          (this->features).shader_tile_image.pNext = (void *)0x0;
        }
        else if (iVar1 == 0x3ba0d4e5) {
          iVar5 = *(int *)((long)pNext + 0);
          iVar6 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          iVar1 = *(int *)((long)pNext + 0x14);
          iVar3 = *(int *)((long)pNext + 0x18);
          iVar4 = *(int *)((long)pNext + 0x1c);
          (this->features).opacity_micromap.micromap = *(int *)((long)pNext + 0x10);
          (this->features).opacity_micromap.micromapCaptureReplay = iVar1;
          (this->features).opacity_micromap.micromapHostCommands = iVar3;
          *(int *)&(this->features).opacity_micromap.field_0x1c = iVar4;
          (this->features).opacity_micromap.sType = iVar5;
          *(int *)&(this->features).opacity_micromap.field_0x4 = iVar6;
          (this->features).opacity_micromap.pNext = pvVar2;
          (this->features).opacity_micromap.pNext = (void *)0x0;
        }
      }
      else if (iVar1 < 0x3ba220e8) {
        if (iVar1 < 0x3ba1bb58) {
          if (iVar1 < 0x3ba13a70) {
            if (iVar1 == 0x3ba10f78) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).border_color_swizzle.borderColorSwizzle =
                   *(int *)((long)pNext + 0x10);
              (this->features).border_color_swizzle.borderColorSwizzleFromImage = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).border_color_swizzle.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).border_color_swizzle.field_0x4 = iVar1;
              (this->features).border_color_swizzle.pNext = pvVar2;
              (this->features).border_color_swizzle.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3ba11748) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).maintenance4.maintenance4 = *(int *)((long)pNext + 0x10);
              *(int *)&(this->features).maintenance4.field_0x14 = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).maintenance4.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).maintenance4.field_0x4 = iVar1;
              (this->features).maintenance4.pNext = pvVar2;
              (this->features).maintenance4.pNext = (void *)0x0;
            }
            else if (iVar1 == 0x3ba12300) {
              iVar1 = *(int *)((long)pNext + 0x14);
              (this->features).shader_subgroup_rotate.shaderSubgroupRotate =
                   *(int *)((long)pNext + 0x10);
              (this->features).shader_subgroup_rotate.shaderSubgroupRotateClustered = iVar1;
              iVar1 = *(int *)((long)pNext + 4);
              pvVar2 = *(void **)((long)pNext + 8);
              (this->features).shader_subgroup_rotate.sType = *(int *)((long)pNext + 0);
              *(int *)&(this->features).shader_subgroup_rotate.field_0x4 = iVar1;
              (this->features).shader_subgroup_rotate.pNext = pvVar2;
              (this->features).shader_subgroup_rotate.pNext = (void *)0x0;
            }
          }
          else if (iVar1 == 0x3ba13a70) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).non_seamless_cube_map.nonSeamlessCubeMap = *(int *)((long)pNext + 0x10)
            ;
            *(int *)&(this->features).non_seamless_cube_map.field_0x14 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).non_seamless_cube_map.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).non_seamless_cube_map.field_0x4 = iVar1;
            (this->features).non_seamless_cube_map.pNext = pvVar2;
            (this->features).non_seamless_cube_map.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3ba151e0) {
            iVar5 = *(int *)((long)pNext + 0);
            iVar6 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            iVar1 = *(int *)((long)pNext + 0x14);
            iVar3 = *(int *)((long)pNext + 0x18);
            iVar4 = *(int *)((long)pNext + 0x1c);
            (this->features).device_generated_commands_compute_nv.deviceGeneratedCompute =
                 *(int *)((long)pNext + 0x10);
            (this->features).device_generated_commands_compute_nv.deviceGeneratedComputePipelines =
                 iVar1;
            (this->features).device_generated_commands_compute_nv.
            deviceGeneratedComputeCaptureReplay = iVar3;
            *(int *)&(this->features).device_generated_commands_compute_nv.field_0x1c = iVar4;
            (this->features).device_generated_commands_compute_nv.sType = iVar5;
            *(int *)&(this->features).device_generated_commands_compute_nv.field_0x4 = iVar6;
            (this->features).device_generated_commands_compute_nv.pNext = pvVar2;
            (this->features).device_generated_commands_compute_nv.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3ba180c0) {
            iVar5 = *(int *)((long)pNext + 0);
            iVar6 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            iVar1 = *(int *)((long)pNext + 0x14);
            iVar3 = *(int *)((long)pNext + 0x18);
            iVar4 = *(int *)((long)pNext + 0x1c);
            (this->features).image_processing_qcom.textureSampleWeighted =
                 *(int *)((long)pNext + 0x10);
            (this->features).image_processing_qcom.textureBoxFilter = iVar1;
            (this->features).image_processing_qcom.textureBlockMatch = iVar3;
            *(int *)&(this->features).image_processing_qcom.field_0x1c = iVar4;
            (this->features).image_processing_qcom.sType = iVar5;
            *(int *)&(this->features).image_processing_qcom.field_0x4 = iVar6;
            (this->features).image_processing_qcom.pNext = pvVar2;
            (this->features).image_processing_qcom.pNext = (void *)0x0;
          }
        }
        else if (iVar1 < 0x3ba1de80) {
          if (iVar1 == 0x3ba1bb58) {
            memcpy(&(this->features).extended_dynamic_state3,pNext,0x90);
            (this->features).extended_dynamic_state3.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3ba1c710) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).subpass_merge_feedback.subpassMergeFeedback =
                 *(int *)((long)pNext + 0x10);
            *(int *)&(this->features).subpass_merge_feedback.field_0x14 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).subpass_merge_feedback.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).subpass_merge_feedback.field_0x4 = iVar1;
            (this->features).subpass_merge_feedback.pNext = pvVar2;
            (this->features).subpass_merge_feedback.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3ba1d6b0) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).shader_module_identifier.shaderModuleIdentifier =
                 *(int *)((long)pNext + 0x10);
            *(int *)&(this->features).shader_module_identifier.field_0x14 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).shader_module_identifier.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).shader_module_identifier.field_0x4 = iVar1;
            (this->features).shader_module_identifier.pNext = pvVar2;
            (this->features).shader_module_identifier.pNext = (void *)0x0;
          }
        }
        else if (iVar1 < 0x3ba1e650) {
          if (iVar1 == 0x3ba1de80) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).optical_flow_nv.opticalFlow = *(int *)((long)pNext + 0x10);
            *(int *)&(this->features).optical_flow_nv.field_0x14 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).optical_flow_nv.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).optical_flow_nv.field_0x4 = iVar1;
            (this->features).optical_flow_nv.pNext = pvVar2;
            (this->features).optical_flow_nv.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3ba1e268) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).legacy_dithering.legacyDithering = *(int *)((long)pNext + 0x10);
            *(int *)&(this->features).legacy_dithering.field_0x14 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).legacy_dithering.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).legacy_dithering.field_0x4 = iVar1;
            (this->features).legacy_dithering.pNext = pvVar2;
            (this->features).legacy_dithering.pNext = (void *)0x0;
          }
        }
        else if (iVar1 == 0x3ba1e650) {
          iVar1 = *(int *)((long)pNext + 0x14);
          (this->features).pipeline_protected_access.pipelineProtectedAccess =
               *(int *)((long)pNext + 0x10);
          *(int *)&(this->features).pipeline_protected_access.field_0x14 = iVar1;
          iVar1 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          (this->features).pipeline_protected_access.sType = *(int *)((long)pNext + 0);
          *(int *)&(this->features).pipeline_protected_access.field_0x4 = iVar1;
          (this->features).pipeline_protected_access.pNext = pvVar2;
          (this->features).pipeline_protected_access.pNext = (void *)0x0;
        }
        else if (iVar1 == 0x3ba1f5f0) {
          iVar1 = *(int *)((long)pNext + 0x14);
          (this->features).maintenance5.maintenance5 = *(int *)((long)pNext + 0x10);
          *(int *)&(this->features).maintenance5.field_0x14 = iVar1;
          iVar1 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          (this->features).maintenance5.sType = *(int *)((long)pNext + 0);
          *(int *)&(this->features).maintenance5.field_0x4 = iVar1;
          (this->features).maintenance5.pNext = pvVar2;
          (this->features).maintenance5.pNext = (void *)0x0;
        }
      }
      else if (iVar1 < 0x3ba2d880) {
        if (iVar1 < 0x3ba28290) {
          if (iVar1 == 0x3ba220e8) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).ray_tracing_position_fetch.rayTracingPositionFetch =
                 *(int *)((long)pNext + 0x10);
            *(int *)&(this->features).ray_tracing_position_fetch.field_0x14 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).ray_tracing_position_fetch.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).ray_tracing_position_fetch.field_0x4 = iVar1;
            (this->features).ray_tracing_position_fetch.pNext = pvVar2;
            (this->features).ray_tracing_position_fetch.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3ba224d0) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).shader_object.shaderObject = *(int *)((long)pNext + 0x10);
            *(int *)&(this->features).shader_object.field_0x14 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).shader_object.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).shader_object.field_0x4 = iVar1;
            (this->features).shader_object.pNext = pvVar2;
            (this->features).shader_object.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3ba25f68) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).shader_core_builtins_arm.shaderCoreBuiltins =
                 *(int *)((long)pNext + 0x10);
            *(int *)&(this->features).shader_core_builtins_arm.field_0x14 = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).shader_core_builtins_arm.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).shader_core_builtins_arm.field_0x4 = iVar1;
            (this->features).shader_core_builtins_arm.pNext = pvVar2;
            (this->features).shader_core_builtins_arm.pNext = (void *)0x0;
          }
        }
        else if (iVar1 < 0x3ba2b170) {
          if (iVar1 == 0x3ba28290) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).cooperative_matrix.cooperativeMatrix = *(int *)((long)pNext + 0x10);
            (this->features).cooperative_matrix.cooperativeMatrixRobustBufferAccess = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).cooperative_matrix.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).cooperative_matrix.field_0x4 = iVar1;
            (this->features).cooperative_matrix.pNext = pvVar2;
            (this->features).cooperative_matrix.pNext = (void *)0x0;
          }
          else if (iVar1 == 0x3ba2a9a0) {
            iVar1 = *(int *)((long)pNext + 0x14);
            (this->features).per_stage_descriptor_set_nv.perStageDescriptorSet =
                 *(int *)((long)pNext + 0x10);
            (this->features).per_stage_descriptor_set_nv.dynamicPipelineLayout = iVar1;
            iVar1 = *(int *)((long)pNext + 4);
            pvVar2 = *(void **)((long)pNext + 8);
            (this->features).per_stage_descriptor_set_nv.sType = *(int *)((long)pNext + 0);
            *(int *)&(this->features).per_stage_descriptor_set_nv.field_0x4 = iVar1;
            (this->features).per_stage_descriptor_set_nv.pNext = pvVar2;
            (this->features).per_stage_descriptor_set_nv.pNext = (void *)0x0;
          }
        }
        else if (iVar1 == 0x3ba2b170) {
          iVar1 = *(int *)((long)pNext + 0x14);
          (this->features).image_processing2_qcom.textureBlockMatch2 = *(int *)((long)pNext + 0x10);
          *(int *)&(this->features).image_processing2_qcom.field_0x14 = iVar1;
          iVar1 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          (this->features).image_processing2_qcom.sType = *(int *)((long)pNext + 0);
          *(int *)&(this->features).image_processing2_qcom.field_0x4 = iVar1;
          (this->features).image_processing2_qcom.pNext = pvVar2;
          (this->features).image_processing2_qcom.pNext = (void *)0x0;
        }
        else if (iVar1 == 0x3ba2c8e0) {
          iVar1 = *(int *)((long)pNext + 0x14);
          (this->features).attachment_feedback_loop_dynamic_state.attachmentFeedbackLoopDynamicState
               = *(int *)((long)pNext + 0x10);
          *(int *)&(this->features).attachment_feedback_loop_dynamic_state.field_0x14 = iVar1;
          iVar1 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          (this->features).attachment_feedback_loop_dynamic_state.sType = *(int *)((long)pNext + 0);
          *(int *)&(this->features).attachment_feedback_loop_dynamic_state.field_0x4 = iVar1;
          (this->features).attachment_feedback_loop_dynamic_state.pNext = pvVar2;
          (this->features).attachment_feedback_loop_dynamic_state.pNext = (void *)0x0;
        }
      }
      else if (iVar1 < 0x3ba35d50) {
        if (iVar1 == 0x3ba2d880) {
          iVar1 = *(int *)((long)pNext + 0x14);
          (this->features).shader_float_controls2.shaderFloatControls2 =
               *(int *)((long)pNext + 0x10);
          *(int *)&(this->features).shader_float_controls2.field_0x14 = iVar1;
          iVar1 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          (this->features).shader_float_controls2.sType = *(int *)((long)pNext + 0);
          *(int *)&(this->features).shader_float_controls2.field_0x4 = iVar1;
          (this->features).shader_float_controls2.pNext = pvVar2;
          (this->features).shader_float_controls2.pNext = (void *)0x0;
        }
        else if (iVar1 == 0x3ba31700) {
          iVar1 = *(int *)((long)pNext + 0x14);
          (this->features).expect_assume.shaderExpectAssume = *(int *)((long)pNext + 0x10);
          *(int *)&(this->features).expect_assume.field_0x14 = iVar1;
          iVar1 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          (this->features).expect_assume.sType = *(int *)((long)pNext + 0);
          *(int *)&(this->features).expect_assume.field_0x4 = iVar1;
          (this->features).expect_assume.pNext = pvVar2;
          (this->features).expect_assume.pNext = (void *)0x0;
        }
        else if (iVar1 == 0x3ba341f8) {
          iVar1 = *(int *)((long)pNext + 0x14);
          (this->features).raw_access_chains_nv.shaderRawAccessChains = *(int *)((long)pNext + 0x10)
          ;
          *(int *)&(this->features).raw_access_chains_nv.field_0x14 = iVar1;
          iVar1 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          (this->features).raw_access_chains_nv.sType = *(int *)((long)pNext + 0);
          *(int *)&(this->features).raw_access_chains_nv.field_0x4 = iVar1;
          (this->features).raw_access_chains_nv.pNext = pvVar2;
          (this->features).raw_access_chains_nv.pNext = (void *)0x0;
        }
      }
      else if (iVar1 < 0x3ba38460) {
        if (iVar1 == 0x3ba35d50) {
          iVar1 = *(int *)((long)pNext + 0x14);
          (this->features).maintenance7.maintenance7 = *(int *)((long)pNext + 0x10);
          *(int *)&(this->features).maintenance7.field_0x14 = iVar1;
          iVar1 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          (this->features).maintenance7.sType = *(int *)((long)pNext + 0);
          *(int *)&(this->features).maintenance7.field_0x4 = iVar1;
          (this->features).maintenance7.pNext = pvVar2;
          (this->features).maintenance7.pNext = (void *)0x0;
        }
        else if (iVar1 == 0x3ba36520) {
          iVar1 = *(int *)((long)pNext + 0x14);
          (this->features).shader_replicated_composites.shaderReplicatedComposites =
               *(int *)((long)pNext + 0x10);
          *(int *)&(this->features).shader_replicated_composites.field_0x14 = iVar1;
          iVar1 = *(int *)((long)pNext + 4);
          pvVar2 = *(void **)((long)pNext + 8);
          (this->features).shader_replicated_composites.sType = *(int *)((long)pNext + 0);
          *(int *)&(this->features).shader_replicated_composites.field_0x4 = iVar1;
          (this->features).shader_replicated_composites.pNext = pvVar2;
          (this->features).shader_replicated_composites.pNext = (void *)0x0;
        }
      }
      else if (iVar1 == 0x3ba38460) {
        iVar1 = *(int *)((long)pNext + 0x14);
        (this->features).device_generated_commands.deviceGeneratedCommands =
             *(int *)((long)pNext + 0x10);
        (this->features).device_generated_commands.dynamicGeneratedPipelineLayout = iVar1;
        iVar1 = *(int *)((long)pNext + 4);
        pvVar2 = *(void **)((long)pNext + 8);
        (this->features).device_generated_commands.sType = *(int *)((long)pNext + 0);
        *(int *)&(this->features).device_generated_commands.field_0x4 = iVar1;
        (this->features).device_generated_commands.pNext = pvVar2;
        (this->features).device_generated_commands.pNext = (void *)0x0;
      }
      else if (iVar1 == 0x3ba3ab70) {
        iVar1 = *(int *)((long)pNext + 0x14);
        (this->features).depth_clamp_control.depthClampControl = *(int *)((long)pNext + 0x10);
        *(int *)&(this->features).depth_clamp_control.field_0x14 = iVar1;
        iVar1 = *(int *)((long)pNext + 4);
        pvVar2 = *(void **)((long)pNext + 8);
        (this->features).depth_clamp_control.sType = *(int *)((long)pNext + 0);
        *(int *)&(this->features).depth_clamp_control.field_0x4 = iVar1;
        (this->features).depth_clamp_control.pNext = pvVar2;
        (this->features).depth_clamp_control.pNext = (void *)0x0;
      }
      pNext = *(void **)((long)pNext + 8);
    } while ((int *)pNext != (int *)0x0);
  }
  return;
}

Assistant:

void FeatureFilter::Impl::init_features(const void *pNext)
{
	while (pNext)
	{
		auto *base = static_cast<const VkBaseInStructure *>(pNext);

#define F(struct_type, member, ...) case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_FEATURES: \
		memcpy(&features.member, base, sizeof(features.member)); \
		features.member.pNext = nullptr; \
		break

#define FE(struct_type, member, ext) case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_FEATURES_##ext: \
		memcpy(&features.member, base, sizeof(features.member)); \
		features.member.pNext = nullptr; \
		break

#define FE_ALIAS(struct_type, member, ext, ext_alias) case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_##struct_type##_FEATURES_##ext: \
		memcpy(&features.member, base, sizeof(features.member)); \
		features.member.pNext = nullptr; \
		break

#define FEATURE(struct_name, core_struct, feature) if (core_struct.feature) features.struct_name.feature = VK_TRUE
		switch (base->sType)
		{
#include "fossilize_feature_filter_features.inc"
		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_1_FEATURES:
		{
			auto &vk11 = *reinterpret_cast<const VkPhysicalDeviceVulkan11Features *>(base);
			FEATURE(storage_16bit, vk11, storageBuffer16BitAccess);
			FEATURE(storage_16bit, vk11, uniformAndStorageBuffer16BitAccess);
			FEATURE(storage_16bit, vk11, storagePushConstant16);
			FEATURE(storage_16bit, vk11, storageInputOutput16);
			FEATURE(multiview, vk11, multiview);
			FEATURE(multiview, vk11, multiviewGeometryShader);
			FEATURE(multiview, vk11, multiviewTessellationShader);
			FEATURE(variable_pointers, vk11, variablePointersStorageBuffer);
			FEATURE(variable_pointers, vk11, variablePointers);
			// protected memory
			FEATURE(ycbcr_conversion, vk11, samplerYcbcrConversion);
			FEATURE(draw_parameters, vk11, shaderDrawParameters);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_2_FEATURES:
		{
			auto &vk12 = *reinterpret_cast<const VkPhysicalDeviceVulkan12Features *>(base);
			//samplerMirrorClampToEdge
			//drawIndirectCount
			FEATURE(storage_8bit, vk12, storageBuffer8BitAccess);
			FEATURE(storage_8bit, vk12, uniformAndStorageBuffer8BitAccess);
			FEATURE(storage_8bit, vk12, storagePushConstant8);
			FEATURE(atomic_int64, vk12, shaderBufferInt64Atomics);
			FEATURE(atomic_int64, vk12, shaderSharedInt64Atomics);
			FEATURE(float16_int8, vk12, shaderFloat16);
			FEATURE(float16_int8, vk12, shaderInt8);
			FEATURE(vk12, vk12, descriptorIndexing);
			FEATURE(descriptor_indexing, vk12, shaderInputAttachmentArrayDynamicIndexing);
			FEATURE(descriptor_indexing, vk12, shaderUniformTexelBufferArrayDynamicIndexing);
			FEATURE(descriptor_indexing, vk12, shaderStorageTexelBufferArrayDynamicIndexing);
			FEATURE(descriptor_indexing, vk12, shaderUniformBufferArrayNonUniformIndexing);
			FEATURE(descriptor_indexing, vk12, shaderSampledImageArrayNonUniformIndexing);
			FEATURE(descriptor_indexing, vk12, shaderStorageBufferArrayNonUniformIndexing);
			FEATURE(descriptor_indexing, vk12, shaderStorageImageArrayNonUniformIndexing);
			FEATURE(descriptor_indexing, vk12, shaderInputAttachmentArrayNonUniformIndexing);
			FEATURE(descriptor_indexing, vk12, shaderUniformTexelBufferArrayNonUniformIndexing);
			FEATURE(descriptor_indexing, vk12, shaderStorageTexelBufferArrayNonUniformIndexing);
			FEATURE(descriptor_indexing, vk12, descriptorBindingUniformBufferUpdateAfterBind);
			FEATURE(descriptor_indexing, vk12, descriptorBindingSampledImageUpdateAfterBind);
			FEATURE(descriptor_indexing, vk12, descriptorBindingStorageImageUpdateAfterBind);
			FEATURE(descriptor_indexing, vk12, descriptorBindingStorageBufferUpdateAfterBind);
			FEATURE(descriptor_indexing, vk12, descriptorBindingUniformTexelBufferUpdateAfterBind);
			FEATURE(descriptor_indexing, vk12, descriptorBindingStorageTexelBufferUpdateAfterBind);
			FEATURE(descriptor_indexing, vk12, descriptorBindingUpdateUnusedWhilePending);
			FEATURE(descriptor_indexing, vk12, descriptorBindingPartiallyBound);
			FEATURE(descriptor_indexing, vk12, descriptorBindingVariableDescriptorCount);
			FEATURE(descriptor_indexing, vk12, runtimeDescriptorArray);
			FEATURE(vk12, vk12, samplerFilterMinmax);
			FEATURE(vk12, vk12, scalarBlockLayout);
			//imagelessFramebuffer;
			//uniformBufferStandardLayout;
			FEATURE(subgroup_extended_types, vk12, shaderSubgroupExtendedTypes);
			FEATURE(separate_ds_layout, vk12, separateDepthStencilLayouts);
			//hostQueryReset;
			//timelineSemaphore;
			FEATURE(buffer_device_address, vk12, bufferDeviceAddress);
			FEATURE(buffer_device_address, vk12, bufferDeviceAddressCaptureReplay);
			FEATURE(buffer_device_address, vk12, bufferDeviceAddressMultiDevice);
			FEATURE(memory_model, vk12, vulkanMemoryModel);
			FEATURE(memory_model, vk12, vulkanMemoryModelDeviceScope);
			FEATURE(memory_model, vk12, vulkanMemoryModelAvailabilityVisibilityChains);
			FEATURE(vk12, vk12, shaderOutputViewportIndex);
			FEATURE(vk12, vk12, shaderOutputLayer);
			//subgroupBroadcastDynamicId;
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_3_FEATURES:
		{
			auto &vk13 = *reinterpret_cast<const VkPhysicalDeviceVulkan13Features *>(base);
			FEATURE(image_robustness, vk13, robustImageAccess);
			FEATURE(inline_uniform_block, vk13, inlineUniformBlock);
			FEATURE(inline_uniform_block, vk13, descriptorBindingInlineUniformBlockUpdateAfterBind);
			//pipelineCreationCacheControl;
			//privateData;
			FEATURE(demote_to_helper, vk13, shaderDemoteToHelperInvocation);
			FEATURE(vk13, vk13, shaderTerminateInvocation);
			FEATURE(subgroup_size_control, vk13, subgroupSizeControl);
			FEATURE(subgroup_size_control, vk13, computeFullSubgroups);
			FEATURE(synchronization2, vk13, synchronization2);
			//textureCompressionASTC_HDR;
			FEATURE(zero_initialize_workgroup_memory, vk13, shaderZeroInitializeWorkgroupMemory);
			FEATURE(dynamic_rendering, vk13, dynamicRendering);
			FEATURE(shader_integer_dot_product, vk13, shaderIntegerDotProduct);
			FEATURE(maintenance4, vk13, maintenance4);
			break;
		}

		case VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_VULKAN_1_4_FEATURES:
		{
			auto &vk14 = *reinterpret_cast<const VkPhysicalDeviceVulkan14Features *>(base);
			FEATURE(dynamic_rendering_local_read, vk14, dynamicRenderingLocalRead);
			FEATURE(shader_subgroup_rotate, vk14, shaderSubgroupRotate);
			FEATURE(shader_subgroup_rotate, vk14, shaderSubgroupRotateClustered);
			FEATURE(shader_float_controls2, vk14, shaderFloatControls2);
			FEATURE(expect_assume, vk14, shaderExpectAssume);
			FEATURE(line_rasterization, vk14, rectangularLines);
			FEATURE(line_rasterization, vk14, bresenhamLines);
			FEATURE(line_rasterization, vk14, smoothLines);
			FEATURE(line_rasterization, vk14, stippledRectangularLines);
			FEATURE(line_rasterization, vk14, stippledBresenhamLines);
			FEATURE(line_rasterization, vk14, stippledSmoothLines);
			FEATURE(attribute_divisor, vk14, vertexAttributeInstanceRateDivisor);
			FEATURE(attribute_divisor, vk14, vertexAttributeInstanceRateZeroDivisor);
			FEATURE(maintenance5, vk14, maintenance5);
			FEATURE(pipeline_protected_access, vk14, pipelineProtectedAccess);
			FEATURE(pipeline_robustness, vk14, pipelineRobustness);
			FEATURE(vk14, vk14, pushDescriptor);
			break;
		}

		default:
			break;
		}

#undef F
#undef FE
#undef FE_ALIAS
#undef FEATURE

		pNext = base->pNext;
	}
}